

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O2

string * google::
         MakeCheckOpString<__gnu_cxx::hash_set<int,__gnu_cxx::hash<int>,std::equal_to<int>,std::allocator<int>>,__gnu_cxx::hash_set<int,__gnu_cxx::hash<int>,std::equal_to<int>,std::allocator<int>>>
                   (hash_set<int,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                    *v1,hash_set<int,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                        *v2,char *exprtext)

{
  ostringstream *in_RAX;
  ostream *out;
  string *psVar1;
  CheckOpMessageBuilder local_28;
  CheckOpMessageBuilder comb;
  
  local_28.stream_ = in_RAX;
  base::CheckOpMessageBuilder::CheckOpMessageBuilder(&local_28,exprtext);
  ::operator<<((ostream *)local_28.stream_,v1);
  out = base::CheckOpMessageBuilder::ForVar2(&local_28);
  ::operator<<(out,v2);
  psVar1 = base::CheckOpMessageBuilder::NewString_abi_cxx11_(&local_28);
  base::CheckOpMessageBuilder::~CheckOpMessageBuilder(&local_28);
  return psVar1;
}

Assistant:

std::string* MakeCheckOpString(const T1& v1, const T2& v2, const char* exprtext) {
  base::CheckOpMessageBuilder comb(exprtext);
  MakeCheckOpValueString(comb.ForVar1(), v1);
  MakeCheckOpValueString(comb.ForVar2(), v2);
  return comb.NewString();
}